

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int fmt::v8::detail::parse_nonnegative_int<char>(char **begin,char *end,int error_value)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int value_00;
  type tVar4;
  char *pcVar5;
  uint local_4c;
  bool local_45;
  uint max;
  long num_digits;
  char *p;
  uint prev;
  uint value;
  char *pcStack_20;
  int error_value_local;
  char *end_local;
  char **begin_local;
  
  local_45 = false;
  if ((*begin != end) && (local_45 = false, '/' < **begin)) {
    local_45 = **begin < ':';
  }
  prev._3_1_ = local_45;
  value = error_value;
  pcStack_20 = end;
  end_local = (char *)begin;
  ignore_unused<bool,char[1]>((bool *)((long)&prev + 3),(char (*) [1])0x29554e);
  p._4_4_ = 0;
  pcVar5 = (char *)*(long *)end_local;
  uVar3 = p._4_4_;
  do {
    p._4_4_ = uVar3;
    num_digits = (long)pcVar5;
    local_4c = p._4_4_ * 10 + *(char *)num_digits + -0x30;
    pcVar5 = (char *)(num_digits + 1);
    bVar2 = false;
    if ((pcVar5 != pcStack_20) && (bVar2 = false, '/' < *pcVar5)) {
      bVar2 = *pcVar5 < ':';
    }
    uVar3 = local_4c;
  } while (bVar2);
  lVar1 = *(long *)end_local;
  *(char **)end_local = pcVar5;
  begin_local._4_4_ = local_4c;
  if (9 < (long)pcVar5 - lVar1) {
    value_00 = std::numeric_limits<int>::max();
    tVar4 = to_unsigned<int>(value_00);
    if (((long)pcVar5 - lVar1 != 10) ||
       ((ulong)tVar4 < (ulong)p._4_4_ * 10 + (ulong)((int)*(char *)num_digits - 0x30))) {
      local_4c = value;
    }
    begin_local._4_4_ = local_4c;
  }
  return begin_local._4_4_;
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  if (num_digits <= std::numeric_limits<int>::digits10)
    return static_cast<int>(value);
  // Check for overflow.
  const unsigned max = to_unsigned((std::numeric_limits<int>::max)());
  return num_digits == std::numeric_limits<int>::digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}